

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O3

void get_random_esis(int nESIs,uint32_t *ESIs)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  void *__s;
  undefined8 uStack_40;
  uint32_t *local_38;
  
  uVar2 = nESIs * 3;
  lVar1 = -((ulong)uVar2 * 4 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar1);
  if (0 < nESIs) {
    uVar5 = 1;
    if (1 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    local_38 = ESIs;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x101778;
    memset(__s,0xff,uVar5 << 2);
    uVar5 = 0;
LAB_00101780:
    do {
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x101785;
      uVar3 = rand();
      uVar3 = uVar3 & 0xffffff;
      uVar6 = (ulong)uVar3 % (ulong)uVar2;
      uVar4 = *(uint *)((long)__s + uVar6 * 4);
      uVar7 = uVar6;
      while (uVar4 != 0xffffffff) {
        if (uVar4 == uVar3) goto LAB_00101780;
        uVar4 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar4;
        if (uVar4 == uVar2) {
          uVar6 = 0;
        }
        uVar7 = (ulong)(int)uVar6;
        uVar4 = *(uint *)((long)__s + uVar7 * 4);
      }
      *(uint *)((long)__s + uVar7 * 4) = uVar3;
      local_38[uVar5] = uVar3;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nESIs);
  }
  return;
}

Assistant:

void get_random_esis(int nESIs, uint32_t* ESIs)
{
	/* We use a linear probing hashing table
	 * to detect collisions.
	 */
	int hashtab_sz = 3*nESIs;
	uint32_t hESIs[hashtab_sz];
	const uint32_t hempty = (uint32_t)-1;
	for (int i = 0; i < hashtab_sz; ++i)
		hESIs[i] = hempty;
	for (int j = 0; j < nESIs; ++j) {
		uint32_t proposed_value;
		bool retry;
		int hidx;
		do {
			proposed_value = rand() & 0xffffff;
			hidx = (int)(proposed_value % hashtab_sz);
			retry = false;
			while (hESIs[hidx] != hempty) {
				if (hESIs[hidx] == proposed_value) {
					retry = true;
					break;
				}
				if (++hidx == hashtab_sz) {
					hidx = 0;
				}
			}
		} while(retry);
		assert(hESIs[hidx] == hempty);
		hESIs[hidx] = proposed_value;
		ESIs[j] = proposed_value;
	}
}